

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

sexp sexp_adjust_fields(sexp dstp,sexp_conflict *types,_func_sexp_void_ptr_sexp *adjust_fn,
                       void *adata)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  undefined8 in_RCX;
  code *in_RDX;
  long in_RSI;
  uint *in_RDI;
  size_t sz;
  sexp dst;
  sexp src;
  int i;
  sexp_conflict *vec;
  size_t type_sexp_cnt;
  sexp type_spec;
  sexp_tag_t tag;
  ulong local_60;
  uint local_4c;
  sexp local_8;
  
  uVar4 = *in_RDI;
  lVar5 = *(long *)(in_RSI + (ulong)uVar4 * 8);
  lVar6 = *(long *)((long)in_RDI + (long)(int)*(short *)(lVar5 + 0x5a));
  uVar1 = *(ushort *)(lVar5 + 0x5c);
  sVar2 = *(short *)(lVar5 + 0x58);
  sVar3 = *(short *)(lVar5 + 0x54);
  local_4c = 0;
  while( true ) {
    if (lVar6 * (ulong)uVar1 + (long)sVar2 <= (ulong)(long)(int)local_4c) {
      local_8 = (sexp)&DAT_0000013e;
      return local_8;
    }
    local_60 = *(ulong *)((long)in_RDI + (long)(int)local_4c * 8 + (long)(int)sVar3);
    if (((local_60 != 0) && ((local_60 & 3) == 0)) &&
       (local_60 = (*in_RDX)(in_RCX,local_60), (local_60 & 3) != 0)) break;
    *(ulong *)((long)in_RDI + (long)(int)local_4c * 8 + (long)(int)sVar3) = local_60;
    local_4c = local_4c + 1;
  }
  sVar7 = strlen(gc_heap_err_str);
  snprintf(gc_heap_err_str + sVar7,0x100 - sVar7," from adjust fields, tag=%u i=%d",(ulong)uVar4,
           (ulong)local_4c);
  local_8 = (sexp)&DAT_0000003e;
  return local_8;
}

Assistant:

static sexp sexp_adjust_fields(sexp dstp, sexp* types, sexp (* adjust_fn)(void *, sexp), void *adata) {
  sexp_tag_t tag           = sexp_pointer_tag(dstp);
  sexp       type_spec     = types[tag];
  size_t     type_sexp_cnt = sexp_type_num_slots_of_object(type_spec, dstp);
  sexp*      vec           = (sexp*)((unsigned char*)dstp + sexp_type_field_base(type_spec));
  int        i;
  
  for (i = 0; i < type_sexp_cnt; i++) {
    sexp src = vec[i];
    sexp dst = src;
    if (src && sexp_pointerp(src)) {
      dst = adjust_fn(adata, src);
      if (!sexp_pointerp(dst)) { 
        size_t sz = strlen(gc_heap_err_str);
        snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust fields, tag=%u i=%d", tag, i);
        return SEXP_FALSE; }
    }
    vec[i] = dst;
  }
  return SEXP_TRUE;
}